

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::DecodeTiledLevel
              (EXRImage *exr_image,EXRHeader *exr_header,OffsetData *offset_data,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
              int pixel_data_size,uchar *head,size_t size,string *err)

{
  undefined4 uVar1;
  bool bVar2;
  int data_height;
  int data_width;
  int iVar3;
  const_reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  size_type sVar7;
  void *pvVar8;
  uchar **ppuVar9;
  const_reference pvVar10;
  uchar **in_RCX;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *in_RDX;
  EXRAttribute *unaff_RBX;
  size_t in_RSI;
  long *in_RDI;
  long in_R9;
  size_t unaff_R12;
  EXRChannelInfo *unaff_R13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_R14;
  ulong in_stack_00000008;
  string *in_stack_00000010;
  bool ret;
  int data_len;
  int tile_coordinates [4];
  uchar *data_ptr;
  size_t data_size;
  tinyexr_uint64 offset;
  int y_tile;
  int x_tile;
  int tile_idx;
  uint error_flag;
  int err_code;
  int num_tiles;
  int num_x_tiles;
  int num_y_tiles;
  int level_index;
  int num_channels;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed4;
  uchar *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 *local_a0;
  ulong local_98;
  value_type local_90;
  int local_88;
  int local_84;
  int compression_type;
  uint local_7c;
  int line_order;
  int in_stack_ffffffffffffffa8;
  
  uVar1 = *(undefined4 *)(in_RSI + 0x78);
  data_height = LevelIndex((int)in_RDI[2],*(int *)((long)in_RDI + 0x14),*(int *)(in_RSI + 0x44),
                           *(int *)&in_RDX[1].
                                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
  pvVar4 = std::
           vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ::operator[](in_RDX,(long)data_height);
  sVar5 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size(pvVar4);
  pvVar4 = std::
           vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ::operator[](in_RDX,(long)data_height);
  pvVar6 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](pvVar4,0);
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar6);
  data_width = (int)sVar7;
  iVar3 = data_width * (int)sVar5;
  line_order = 0;
  local_7c = 0;
  pvVar8 = calloc(0x20,(long)iVar3);
  *in_RDI = (long)pvVar8;
  for (compression_type = 0; compression_type < iVar3; compression_type = compression_type + 1) {
    ppuVar9 = AllocateImage(in_stack_fffffffffffffed4,
                            (EXRChannelInfo *)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                            (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    *(uchar ***)(*in_RDI + (long)compression_type * 0x20 + 0x18) = ppuVar9;
    local_84 = compression_type % data_width;
    local_88 = compression_type / data_width;
    pvVar4 = std::
             vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ::operator[](in_RDX,(long)data_height);
    pvVar6 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](pvVar4,(long)local_88);
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (pvVar6,(long)local_84);
    local_90 = *pvVar10;
    if (in_stack_00000008 < local_90 + 0x14) {
      local_7c = local_7c | 2;
    }
    else {
      local_98 = in_stack_00000008 - (local_90 + 0x14);
      local_a0 = (undefined8 *)(in_R9 + local_90);
      local_b8 = *local_a0;
      local_b0 = local_a0[1];
      swap4((int *)&local_b8);
      swap4((int *)((long)&local_b8 + 4));
      swap4((int *)&local_b0);
      swap4((int *)((long)&local_b0 + 4));
      if ((int)local_b0 == (int)in_RDI[2]) {
        if (local_b0._4_4_ == *(int *)((long)in_RDI + 0x14)) {
          local_bc = *(int *)(local_a0 + 2);
          swap4(&local_bc);
          if ((local_bc < 2) || (local_98 < (ulong)(long)local_bc)) {
            local_7c = local_7c | 2;
          }
          else {
            local_a0 = (undefined8 *)((long)local_a0 + 0x14);
            in_stack_fffffffffffffeb8 = (int)in_RDI[4];
            in_stack_fffffffffffffec0 = *(undefined4 *)((long)in_RDI + 0x24);
            in_stack_fffffffffffffec8 = (int)local_b8;
            bVar2 = DecodeTiledPixelData
                              (in_RCX,(int *)CONCAT44((int)local_b8,in_stack_fffffffffffffec0),
                               (int *)CONCAT44(in_stack_fffffffffffffeb8,*(undefined4 *)(in_RSI + 4)
                                              ),
                               (int *)CONCAT44(*(undefined4 *)(in_RSI + 0x7c),
                                               in_stack_ffffffffffffff20),in_stack_ffffffffffffff18,
                               (size_t)in_RCX,compression_type,line_order,data_width,data_height,
                               (int)in_R9,in_stack_ffffffffffffffa8,(int)in_RCX,(int)in_RDX,in_RSI,
                               (size_t)in_RDI,unaff_RBX,unaff_R12,unaff_R13,unaff_R14);
            if (!bVar2) {
              local_7c = local_7c | 4;
            }
            *(int *)(*in_RDI + (long)compression_type * 0x20) = (int)local_b8;
            *(undefined4 *)(*in_RDI + (long)compression_type * 0x20 + 4) = local_b8._4_4_;
            *(int *)(*in_RDI + (long)compression_type * 0x20 + 8) = (int)local_b0;
            *(int *)(*in_RDI + (long)compression_type * 0x20 + 0xc) = local_b0._4_4_;
          }
        }
        else {
          local_7c = local_7c | 1;
        }
      }
      else {
        local_7c = local_7c | 1;
      }
    }
  }
  *(undefined4 *)(in_RDI + 5) = uVar1;
  *(int *)((long)in_RDI + 0x2c) = iVar3;
  if (local_7c != 0) {
    line_order = -4;
  }
  if (in_stack_00000010 != (string *)0x0) {
    if ((local_7c & 2) != 0) {
      std::__cxx11::string::operator+=(in_stack_00000010,"Insufficient data length.\n");
    }
    if ((local_7c & 4) != 0) {
      std::__cxx11::string::operator+=(in_stack_00000010,"Failed to decode tile data.\n");
    }
  }
  return line_order;
}

Assistant:

static int DecodeTiledLevel(EXRImage* exr_image, const EXRHeader* exr_header,
  const OffsetData& offset_data,
  const std::vector<size_t>& channel_offset_list,
  int pixel_data_size,
  const unsigned char* head, const size_t size,
  std::string* err) {
  int num_channels = exr_header->num_channels;

  int level_index = LevelIndex(exr_image->level_x, exr_image->level_y, exr_header->tile_level_mode, offset_data.num_x_levels);
  int num_y_tiles = int(offset_data.offsets[size_t(level_index)].size());
  assert(num_y_tiles);
  int num_x_tiles = int(offset_data.offsets[size_t(level_index)][0].size());
  assert(num_x_tiles);
  int num_tiles = num_x_tiles * num_y_tiles;

  int err_code = TINYEXR_SUCCESS;

  enum {
    EF_SUCCESS = 0,
    EF_INVALID_DATA = 1,
    EF_INSUFFICIENT_DATA = 2,
    EF_FAILED_TO_DECODE = 4
  };
#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::atomic<unsigned> error_flag(EF_SUCCESS);
#else
  unsigned error_flag(EF_SUCCESS);
#endif
  
  // Although the spec says : "...the data window is subdivided into an array of smaller rectangles...",
  // the IlmImf library allows the dimensions of the tile to be larger (or equal) than the dimensions of the data window.
#if 0
  if ((exr_header->tile_size_x > exr_image->width || exr_header->tile_size_y > exr_image->height) &&
    exr_image->level_x == 0 && exr_image->level_y == 0) {
    if (err) {
      (*err) += "Failed to decode tile data.\n";
    }
    err_code = TINYEXR_ERROR_INVALID_DATA;
  }
#endif
  exr_image->tiles = static_cast<EXRTile*>(
    calloc(sizeof(EXRTile), static_cast<size_t>(num_tiles)));

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::vector<std::thread> workers;
  std::atomic<int> tile_count(0);

  int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
  if (num_threads > int(num_tiles)) {
    num_threads = int(num_tiles);
  }

  for (int t = 0; t < num_threads; t++) {
    workers.emplace_back(std::thread([&]()
      {
        int tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
  for (int tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
    // Allocate memory for each tile.
    exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
      num_channels, exr_header->channels,
      exr_header->requested_pixel_types, exr_header->tile_size_x,
      exr_header->tile_size_y);

    int x_tile = tile_idx % num_x_tiles;
    int y_tile = tile_idx / num_x_tiles;
    // 16 byte: tile coordinates
    // 4 byte : data size
    // ~      : data(uncompressed or compressed)
    tinyexr::tinyexr_uint64 offset = offset_data.offsets[size_t(level_index)][size_t(y_tile)][size_t(x_tile)];
    if (offset + sizeof(int) * 5 > size) {
      // Insufficient data size.
      error_flag |= EF_INSUFFICIENT_DATA; 
      continue;
    }

    size_t data_size =
      size_t(size - (offset + sizeof(int) * 5));
    const unsigned char* data_ptr =
      reinterpret_cast<const unsigned char*>(head + offset);

    int tile_coordinates[4];
    memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
    tinyexr::swap4(&tile_coordinates[0]);
    tinyexr::swap4(&tile_coordinates[1]);
    tinyexr::swap4(&tile_coordinates[2]);
    tinyexr::swap4(&tile_coordinates[3]);

    if (tile_coordinates[2] != exr_image->level_x) {
      // Invalid data.
      error_flag |= EF_INVALID_DATA;
      continue;
    }
    if (tile_coordinates[3] != exr_image->level_y) {
      // Invalid data.
      error_flag |= EF_INVALID_DATA;
      continue;
    }

    int data_len;
    memcpy(&data_len, data_ptr + 16,
      sizeof(int));  // 16 = sizeof(tile_coordinates)
    tinyexr::swap4(&data_len);

    if (data_len < 2 || size_t(data_len) > data_size) {
      // Insufficient data size.
      error_flag |= EF_INSUFFICIENT_DATA;
      continue;
    }

    // Move to data addr: 20 = 16 + 4;
    data_ptr += 20;
    bool ret = tinyexr::DecodeTiledPixelData(
      exr_image->tiles[tile_idx].images,
      &(exr_image->tiles[tile_idx].width),
      &(exr_image->tiles[tile_idx].height),
      exr_header->requested_pixel_types, data_ptr,
      static_cast<size_t>(data_len), exr_header->compression_type,
      exr_header->line_order,
      exr_image->width, exr_image->height,
      tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
      exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
      static_cast<size_t>(exr_header->num_custom_attributes),
      exr_header->custom_attributes,
      static_cast<size_t>(exr_header->num_channels),
      exr_header->channels, channel_offset_list);

    if (!ret) {
      // Failed to decode tile data.
      error_flag |= EF_FAILED_TO_DECODE;
    }

    exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
    exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
    exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
    exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  }  
        }));
    }  // num_thread loop

    for (auto& t : workers) {
      t.join();
    }

#else
  } // parallel for
#endif

  // Even in the event of an error, the reserved memory may be freed.
  exr_image->num_channels = num_channels;
  exr_image->num_tiles = static_cast<int>(num_tiles);

  if (error_flag)  err_code = TINYEXR_ERROR_INVALID_DATA;
  if (err) {
    if (error_flag & EF_INSUFFICIENT_DATA) {
      (*err) += "Insufficient data length.\n";
    }
    if (error_flag & EF_FAILED_TO_DECODE) {
      (*err) += "Failed to decode tile data.\n";
    }
  }
  return err_code;
}